

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O0

bool __thiscall
libwebm::VpxPesParser::ParsePesOptionalHeader(VpxPesParser *this,PesOptionalHeader *header)

{
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  reference pvVar5;
  byte *pbVar6;
  ulong local_68;
  size_t i;
  size_t bytes_left;
  size_t offset;
  undefined1 local_40 [8];
  PacketData poh_buffer;
  size_t consumed;
  PesOptionalHeader *header_local;
  VpxPesParser *this_local;
  
  if (((header == (PesOptionalHeader *)0x0) || (*(int *)(this + 0x78) != 2)) ||
     (*(ulong *)(this + 0x38) <= *(ulong *)(this + 0x70))) {
    return false;
  }
  poh_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),
                      *(size_type *)(this + 0x70));
  bVar2 = RemoveStartCodeEmulationPreventionBytes
                    (this,pvVar5,*(size_t *)(this + 0x18),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                     (size_t *)
                     &poh_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    header->marker = (int)(*pbVar6 & 0x80) >> 6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    header->scrambling = (int)(*pbVar6 & 0x30) >> 4;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    header->priority = (int)(*pbVar6 & 8) >> 3;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    header->data_alignment = (int)(*pbVar6 & 0xc) >> 2;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    header->copyright = (int)(*pbVar6 & 2) >> 1;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    header->original = *pbVar6 & 1;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,1);
    header->has_pts = (int)(*pbVar6 & 0x80) >> 7;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,1);
    header->has_dts = (int)(*pbVar6 & 0x40) >> 6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,1);
    header->unused_fields = *pbVar6 & 0x3f;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,2);
    header->remaining_size = (uint)*pbVar6;
    if (header->remaining_size == (int)*(undefined8 *)(this + 0x28)) {
      i = (size_t)header->remaining_size;
      bytes_left = 3;
      if (header->has_pts != 0) {
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,3);
        header->pts_dts_flag = (int)(*pbVar6 & 0x20) >> 4;
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,3);
        if ((((*pbVar6 & 1) != 1) ||
            (pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,5
                                ), (*pbVar6 & 1) != 1)) ||
           (pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,7)
           , (*pbVar6 & 1) != 1)) {
          this_local._7_1_ = false;
          goto LAB_001181a1;
        }
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,3);
        bVar1 = *pbVar6;
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,4);
        uVar3 = ReadUint16(pvVar5);
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,6);
        uVar4 = ReadUint16(pvVar5);
        header->pts = (long)(int)((bVar1 & 6) << 0x1d | (uVar3 & 0xfffe) << 0xe |
                                 (int)(uint)uVar4 >> 1);
        bytes_left = 8;
        i = i - 5;
      }
      for (local_68 = 0; local_68 < i; local_68 = local_68 + 1) {
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                            bytes_left + local_68);
        if (*pvVar5 != 0xff) {
          this_local._7_1_ = false;
          goto LAB_001181a1;
        }
      }
      *(pointer *)(this + 0x70) =
           poh_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + *(long *)(this + 0x70);
      *(undefined4 *)(this + 0x78) = 3;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_001181a1:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool VpxPesParser::ParsePesOptionalHeader(PesOptionalHeader* header) {
  if (!header || parse_state_ != kParsePesOptionalHeader ||
      read_pos_ >= pes_file_size_) {
    return false;
  }

  std::size_t consumed = 0;
  PacketData poh_buffer;
  if (!RemoveStartCodeEmulationPreventionBytes(&pes_file_data_[read_pos_],
                                               kPesOptionalHeaderSize,
                                               &poh_buffer, &consumed)) {
    return false;
  }

  std::size_t offset = 0;
  header->marker = (poh_buffer[offset] & 0x80) >> 6;
  header->scrambling = (poh_buffer[offset] & 0x30) >> 4;
  header->priority = (poh_buffer[offset] & 0x8) >> 3;
  header->data_alignment = (poh_buffer[offset] & 0xc) >> 2;
  header->copyright = (poh_buffer[offset] & 0x2) >> 1;
  header->original = poh_buffer[offset] & 0x1;
  offset++;

  header->has_pts = (poh_buffer[offset] & 0x80) >> 7;
  header->has_dts = (poh_buffer[offset] & 0x40) >> 6;
  header->unused_fields = poh_buffer[offset] & 0x3f;
  offset++;

  header->remaining_size = poh_buffer[offset];
  if (header->remaining_size !=
      static_cast<int>(kWebm2PesOptHeaderRemainingSize))
    return false;

  size_t bytes_left = header->remaining_size;
  offset++;

  if (header->has_pts) {
    // Read PTS markers. Format:
    // PTS: 5 bytes
    //   4 bits (flag: PTS present, but no DTS): 0x2 ('0010')
    //   36 bits (90khz PTS):
    //     top 3 bits
    //     marker ('1')
    //     middle 15 bits
    //     marker ('1')
    //     bottom 15 bits
    //     marker ('1')
    // TODO(tomfinegan): read/store the timestamp.
    header->pts_dts_flag = (poh_buffer[offset] & 0x20) >> 4;
    // Check the marker bits.
    if ((poh_buffer[offset + 0] & 1) != 1 ||
        (poh_buffer[offset + 2] & 1) != 1 ||
        (poh_buffer[offset + 4] & 1) != 1) {
      return false;
    }

    header->pts = (poh_buffer[offset] & 0xe) << 29 |
                  ((ReadUint16(&poh_buffer[offset + 1]) & ~1) << 14) |
                  (ReadUint16(&poh_buffer[offset + 3]) >> 1);
    offset += 5;
    bytes_left -= 5;
  }

  // Validate stuffing byte(s).
  for (size_t i = 0; i < bytes_left; ++i) {
    if (poh_buffer[offset + i] != 0xff)
      return false;
  }

  read_pos_ += consumed;
  parse_state_ = kParseBcmvHeader;

  return true;
}